

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O1

Oop __thiscall Lodtalk::VMContext::setGlobalVariable(VMContext *this,Oop symbol,Oop value)

{
  uint uVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  Ref<Lodtalk::Association> newGlobalVar;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  VMContext *local_38;
  
  aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)
          HashedCollection::
          internalKeyValueAtOrNil<Lodtalk::Oop(Lodtalk::Oop),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
                    ((HashedCollection *)this->globalDictionary,symbol,getLookupKeyKey,
                     identityHashOf,identityOopEquals);
  if ((((((ulong)aVar2 & 1) == 0) && (uVar1 = aVar2._0_4_ & 6, uVar1 != 2)) && (uVar1 != 4)) &&
     ((uint)((ulong)*(undefined8 *)aVar2 >> 0x2a) == 0x2c)) {
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)aVar2 + 0x10) = value.field_0;
  }
  else {
    aVar2.header = (ObjectHeader *)Association::newNativeKeyValue(this,0x2c,symbol,value);
    local_40.pointer = (uint8_t *)&NilObject;
    local_38 = this;
    OopRef::registerSelf((OopRef *)&local_40);
    local_40.header = aVar2.header;
    HashedCollection::
    internalPutKeyValue<Lodtalk::Oop(Lodtalk::Oop),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
              ((HashedCollection *)this->globalDictionary,this,(Oop)aVar2,getLookupKeyKey,
               identityHashOf,identityOopEquals);
    aVar2 = local_40;
    OopRef::unregisterSelf((OopRef *)&local_40);
  }
  return (Oop)aVar2.pointer;
}

Assistant:

Oop VMContext::setGlobalVariable(Oop symbol, Oop value)
{
	// Set the existing value.
	auto globalVar = globalDictionary->getNativeAssociationOrNil(symbol);
	if(classIndexOf(Oop::fromPointer(globalVar)) == SCI_GlobalVariable)
	{
		globalVar->value = value;
		return Oop::fromPointer(globalVar);
	}

	// Create the global variable
	Ref<Association> newGlobalVar(this, GlobalVariable::make(this, symbol, value));
	globalDictionary->putNativeAssociation(this, newGlobalVar.get());
	return newGlobalVar.getOop();
}